

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

_compilation_result __thiscall
glcts::TessellationShaderError5InputBlocks::getCompilationResult
          (TessellationShaderError5InputBlocks *this,_pipeline_stage pipeline_stage)

{
  _pipeline_stage pipeline_stage_local;
  TessellationShaderError5InputBlocks *this_local;
  
  this_local._4_4_ = (_compilation_result)(pipeline_stage == PIPELINE_STAGE_TESSELLATION_EVALUATION)
  ;
  return this_local._4_4_;
}

Assistant:

TessellationShaderErrorsTestCaseBase::_compilation_result TessellationShaderError5InputBlocks::getCompilationResult(
	_pipeline_stage pipeline_stage)
{
	/* Tessellation evaluation shader is allowed to fail to compile,
	 * shaders for all other stages should compile successfully */
	switch (pipeline_stage)
	{
	case PIPELINE_STAGE_TESSELLATION_EVALUATION:
		return COMPILATION_RESULT_CAN_FAIL;
	default:
		return COMPILATION_RESULT_MUST_SUCCEED;
	}
}